

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::finish
          (ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar2;
  ArrayDisposer *pAVar3;
  Array<kj::ArrayPtr<const_unsigned_char>_> *result;
  Array<kj::ArrayPtr<const_unsigned_char>_> *in_RDI;
  
  pAVar1 = this->ptr;
  pRVar2 = this->pos;
  pAVar3 = this->disposer;
  in_RDI->ptr = pAVar1;
  in_RDI->size_ = (long)pRVar2 - (long)pAVar1 >> 4;
  in_RDI->disposer = pAVar3;
  this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  this->pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  this->endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
  return in_RDI;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }